

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O1

void __thiscall
cmComputeLinkInformation::GetRPath
          (cmComputeLinkInformation *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *runtimeDirs,bool for_install)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pcVar4;
  size_type sVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  char *pcVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar12;
  long lVar13;
  char *pcVar14;
  LinkClosure *pLVar15;
  long *plVar16;
  ulong *puVar17;
  size_type *psVar18;
  byte bVar19;
  pointer pbVar20;
  ulong uVar21;
  byte bVar22;
  ulong uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  bool bVar25;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar26;
  string d;
  string rootPath;
  string suffix;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  string local_1b8;
  undefined4 local_194;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  allocator local_14b;
  allocator local_14a;
  allocator local_149;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  uint local_134;
  char *local_130;
  undefined1 local_128 [32];
  _Base_ptr local_108;
  size_t local_100;
  char *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = this->Makefile;
  local_148 = runtimeDirs;
  local_128._0_8_ = local_128 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"CMAKE_SKIP_RPATH","");
  bVar8 = cmMakefile::IsOn(pcVar2,(string *)local_128);
  bVar25 = (this->RuntimeFlag)._M_string_length == 0;
  if ((undefined1 *)local_128._0_8_ != local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  uVar23 = CONCAT71((int7)((ulong)pcVar2 >> 8),1);
  if (!for_install) {
    pcVar3 = this->Target;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"BUILD_WITH_INSTALL_RPATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_50);
    uVar23 = CONCAT71(extraout_var,bVar9) & 0xffffffff;
  }
  if ((!for_install) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 || bVar25) {
    bVar19 = 0;
    uVar21 = 0;
  }
  else {
    bVar9 = cmGeneratorTarget::HaveInstallTreeRPATH(this->Target);
    bVar19 = bVar9 & (byte)uVar23;
    bVar9 = cmGeneratorTarget::HaveBuildTreeRPATH(this->Target,&this->Config);
    uVar21 = CONCAT71((int7)((uVar23 & 0xffffffff) >> 8),((byte)(uVar23 & 0xffffffff) ^ 1) & bVar9);
  }
  bVar22 = (byte)uVar23 ^ 1;
  if ((bVar8 || bVar25) || bVar22 != 0) {
LAB_003dd2fc:
    bVar9 = false;
    local_194 = 0;
  }
  else {
    pcVar2 = this->Makefile;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"CMAKE_SKIP_INSTALL_RPATH","");
    bVar9 = cmMakefile::IsOn(pcVar2,&local_70);
    if (bVar9) goto LAB_003dd2fc;
    pcVar3 = this->Target;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"INSTALL_RPATH_USE_LINK_PATH","");
    bVar9 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&local_90);
    local_194 = (undefined4)CONCAT71(extraout_var_00,bVar9);
    bVar9 = true;
  }
  if ((bVar9) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (((!bVar8 && !bVar25) && bVar22 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_128._24_8_ = local_128 + 8;
  local_128._8_4_ = _S_red;
  local_128._16_8_ = 0;
  local_100 = 0;
  paVar24 = &local_190.field_2;
  local_108 = (_Base_ptr)local_128._24_8_;
  if (bVar19 != 0) {
    pcVar3 = this->Target;
    local_190._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"INSTALL_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar3,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar24) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    cmCLI_ExpandListUnique
              (pcVar11,local_148,
               (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_128);
  }
  if ((char)uVar21 == '\0') {
    if ((char)local_194 == '\0') goto LAB_003ddbe0;
  }
  else {
    pcVar3 = this->Target;
    local_190._M_dataplus._M_p = (pointer)paVar24;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"BUILD_RPATH","");
    pcVar11 = cmGeneratorTarget::GetProperty(pcVar3,&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != paVar24) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
    if (pcVar11 != (char *)0x0) {
      cmCLI_ExpandListUnique
                (pcVar11,local_148,
                 (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_128);
    }
    if ((char)uVar21 == '\0' && (char)local_194 == '\0') goto LAB_003ddbe0;
  }
  local_190._M_string_length = 0;
  local_190.field_2._M_allocated_capacity =
       local_190.field_2._M_allocated_capacity & 0xffffffffffffff00;
  pcVar2 = this->Makefile;
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  local_190._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"CMAKE_SYSROOT_LINK","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  sVar5 = local_190._M_string_length;
  if (pcVar11 == (char *)0x0) {
    pcVar2 = this->Makefile;
    local_1b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"CMAKE_SYSROOT","");
    pcVar11 = cmMakefile::GetSafeDefinition(pcVar2,&local_1b8);
    sVar5 = local_190._M_string_length;
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&local_190,0,(char *)sVar5,(ulong)pcVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    strlen(pcVar11);
    std::__cxx11::string::_M_replace((ulong)&local_190,0,(char *)sVar5,(ulong)pcVar11);
  }
  paVar24 = &local_1b8.field_2;
  pcVar2 = this->Makefile;
  local_1b8._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"CMAKE_STAGING_PREFIX","");
  pcVar11 = cmMakefile::GetDefinition(pcVar2,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar24) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  pcVar2 = this->Makefile;
  local_1b8._M_dataplus._M_p = (pointer)paVar24;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"CMAKE_INSTALL_PREFIX","");
  local_130 = cmMakefile::GetSafeDefinition(pcVar2,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar24) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  cmsys::SystemTools::ConvertToUnixSlashes(&local_190);
  pvVar12 = cmOrderDirectories::GetOrderedDirectories_abi_cxx11_(this->OrderRuntimeSearchPath);
  pbVar20 = (pvVar12->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = pvVar12;
  uVar7 = (uint)uVar21;
  pcVar14 = pcVar11;
  if (pbVar20 !=
      (pvVar12->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_f8 = pcVar14;
      local_134 = uVar7;
      local_140 = pvVar6;
      if ((char)uVar21 == '\0') {
        if ((char)local_194 != '\0') {
          pcVar11 = cmake::GetHomeDirectory(this->CMakeInstance);
          pcVar14 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
          std::__cxx11::string::string((string *)&local_1b8,pcVar11,(allocator *)&local_170);
          bVar8 = cmsys::SystemTools::ComparePath(pbVar20,&local_1b8);
          if (bVar8) {
LAB_003dd84b:
            bVar25 = false;
LAB_003dd84e:
            bVar9 = false;
            bVar10 = false;
          }
          else {
            std::__cxx11::string::string((string *)&local_b0,pcVar14,&local_149);
            bVar25 = cmsys::SystemTools::ComparePath(pbVar20,&local_b0);
            if (bVar25) goto LAB_003dd84b;
            std::__cxx11::string::string((string *)&local_d0,pcVar11,&local_14a);
            bVar25 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_d0);
            if (bVar25) {
              bVar25 = true;
              goto LAB_003dd84e;
            }
            std::__cxx11::string::string((string *)&local_f0,pcVar14,&local_14b);
            bVar10 = cmsys::SystemTools::IsSubDirectory(pbVar20,&local_f0);
            bVar10 = !bVar10;
            bVar25 = true;
            bVar9 = true;
          }
          if ((bVar9) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2)) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          if ((bVar25) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2)) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          pvVar12 = local_140;
          if ((!bVar8) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2)) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          pcVar11 = local_f8;
          if (bVar10) {
            pcVar4 = (pbVar20->_M_dataplus)._M_p;
            local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b8,pcVar4,pcVar4 + pbVar20->_M_string_length);
            if (((char *)local_190._M_string_length == (char *)0x0) ||
               (lVar13 = std::__cxx11::string::find
                                   ((char *)&local_1b8,(ulong)local_190._M_dataplus._M_p,0),
               lVar13 != 0)) {
              if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
                strlen(pcVar11);
                lVar13 = std::__cxx11::string::find((char *)&local_1b8,(ulong)pcVar11,0);
                if (lVar13 == 0) {
                  strlen(pcVar11);
                  std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_1b8);
                  pcVar14 = local_130;
                  sVar5 = local_1b8._M_string_length;
                  strlen(local_130);
                  std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)sVar5,(ulong)pcVar14)
                  ;
                  std::__cxx11::string::append((char *)&local_1b8);
                  std::__cxx11::string::_M_append
                            ((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
                  cmsys::SystemTools::ConvertToUnixSlashes(&local_1b8);
                  pvVar12 = local_140;
                  uVar21 = (ulong)local_134;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_170._M_dataplus._M_p != &local_170.field_2) {
                    operator_delete(local_170._M_dataplus._M_p,
                                    local_170.field_2._M_allocated_capacity + 1);
                  }
                }
              }
            }
            else {
              std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_1b8);
              std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_170);
              pvVar12 = local_140;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
                pvVar12 = local_140;
              }
            }
            pVar26 = std::
                     _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                     ::_M_insert_unique<std::__cxx11::string_const&>
                               ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                 *)local_128,&local_1b8);
            if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_148,&local_1b8);
            }
            goto LAB_003ddaa7;
          }
        }
      }
      else {
        pcVar4 = (pbVar20->_M_dataplus)._M_p;
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,pcVar4,pcVar4 + pbVar20->_M_string_length);
        if (((char *)local_190._M_string_length == (char *)0x0) ||
           (lVar13 = std::__cxx11::string::find
                               ((char *)&local_1b8,(ulong)local_190._M_dataplus._M_p,0), lVar13 != 0
           )) {
          if ((pcVar11 != (char *)0x0) && (*pcVar11 != '\0')) {
            strlen(pcVar11);
            lVar13 = std::__cxx11::string::find((char *)&local_1b8,(ulong)pcVar11,0);
            if (lVar13 == 0) {
              strlen(pcVar11);
              std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_1b8);
              pcVar14 = local_130;
              sVar5 = local_1b8._M_string_length;
              strlen(local_130);
              std::__cxx11::string::_M_replace((ulong)&local_1b8,0,(char *)sVar5,(ulong)pcVar14);
              std::__cxx11::string::append((char *)&local_1b8);
              std::__cxx11::string::_M_append((char *)&local_1b8,(ulong)local_170._M_dataplus._M_p);
              cmsys::SystemTools::ConvertToUnixSlashes(&local_1b8);
              pvVar12 = local_140;
              uVar21 = (ulong)local_134;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p != &local_170.field_2) {
                operator_delete(local_170._M_dataplus._M_p,
                                local_170.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        else {
          std::__cxx11::string::substr((ulong)&local_170,(ulong)&local_1b8);
          std::__cxx11::string::operator=((string *)&local_1b8,(string *)&local_170);
          pvVar12 = local_140;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
            pvVar12 = local_140;
          }
        }
        pVar26 = std::
                 _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 ::_M_insert_unique<std::__cxx11::string_const&>
                           ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                             *)local_128,&local_1b8);
        if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(local_148,&local_1b8);
        }
LAB_003ddaa7:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      pbVar20 = pbVar20 + 1;
      pvVar6 = local_140;
      uVar7 = local_134;
      pcVar14 = local_f8;
    } while (pbVar20 !=
             (pvVar12->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
LAB_003ddbe0:
  pLVar15 = cmGeneratorTarget::GetLinkClosure(this->Target,&this->Config);
  pbVar20 = (pLVar15->Languages).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pbVar20 !=
      (pLVar15->Languages).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar24 = &local_1b8.field_2;
    do {
      std::operator+(&local_1b8,"CMAKE_",pbVar20);
      plVar16 = (long *)std::__cxx11::string::append((char *)&local_1b8);
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      puVar17 = (ulong *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_190.field_2._M_allocated_capacity = *puVar17;
        local_190.field_2._8_8_ = plVar16[3];
      }
      else {
        local_190.field_2._M_allocated_capacity = *puVar17;
        local_190._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_190._M_string_length = plVar16[1];
      *plVar16 = (long)puVar17;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != paVar24) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      bVar8 = cmMakefile::IsOn(this->Makefile,&local_190);
      if (bVar8) {
        std::operator+(&local_170,"CMAKE_",pbVar20);
        plVar16 = (long *)std::__cxx11::string::append((char *)&local_170);
        psVar18 = (size_type *)(plVar16 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar16 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar18) {
          local_1b8.field_2._M_allocated_capacity = *psVar18;
          local_1b8.field_2._8_8_ = plVar16[3];
          local_1b8._M_dataplus._M_p = (pointer)paVar24;
        }
        else {
          local_1b8.field_2._M_allocated_capacity = *psVar18;
          local_1b8._M_dataplus._M_p = (pointer)*plVar16;
        }
        local_1b8._M_string_length = plVar16[1];
        *plVar16 = (long)psVar18;
        plVar16[1] = 0;
        *(undefined1 *)(plVar16 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_170._M_dataplus._M_p != &local_170.field_2) {
          operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
        }
        pcVar11 = cmMakefile::GetDefinition(this->Makefile,&local_1b8);
        if (pcVar11 != (char *)0x0) {
          cmCLI_ExpandListUnique
                    (pcVar11,local_148,
                     (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_128);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != paVar24) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      pbVar20 = pbVar20 + 1;
    } while (pbVar20 !=
             (pLVar15->Languages).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmCLI_ExpandListUnique
            ((this->RuntimeAlways)._M_dataplus._M_p,local_148,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_128);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_128);
  return;
}

Assistant:

void cmComputeLinkInformation::GetRPath(std::vector<std::string>& runtimeDirs,
                                        bool for_install)
{
  // Select whether to generate runtime search directories.
  bool outputRuntime =
    !this->Makefile->IsOn("CMAKE_SKIP_RPATH") && !this->RuntimeFlag.empty();

  // Select whether to generate an rpath for the install tree or the
  // build tree.
  bool linking_for_install =
    (for_install ||
     this->Target->GetPropertyAsBool("BUILD_WITH_INSTALL_RPATH"));
  bool use_install_rpath =
    (outputRuntime && this->Target->HaveInstallTreeRPATH() &&
     linking_for_install);
  bool use_build_rpath =
    (outputRuntime && this->Target->HaveBuildTreeRPATH(this->Config) &&
     !linking_for_install);
  bool use_link_rpath = outputRuntime && linking_for_install &&
    !this->Makefile->IsOn("CMAKE_SKIP_INSTALL_RPATH") &&
    this->Target->GetPropertyAsBool("INSTALL_RPATH_USE_LINK_PATH");

  // Construct the RPATH.
  std::set<std::string> emitted;
  if (use_install_rpath) {
    const char* install_rpath = this->Target->GetProperty("INSTALL_RPATH");
    cmCLI_ExpandListUnique(install_rpath, runtimeDirs, emitted);
  }
  if (use_build_rpath) {
    // Add directories explicitly specified by user
    if (const char* build_rpath = this->Target->GetProperty("BUILD_RPATH")) {
      cmCLI_ExpandListUnique(build_rpath, runtimeDirs, emitted);
    }
  }
  if (use_build_rpath || use_link_rpath) {
    std::string rootPath;
    if (const char* sysrootLink =
          this->Makefile->GetDefinition("CMAKE_SYSROOT_LINK")) {
      rootPath = sysrootLink;
    } else {
      rootPath = this->Makefile->GetSafeDefinition("CMAKE_SYSROOT");
    }
    const char* stagePath =
      this->Makefile->GetDefinition("CMAKE_STAGING_PREFIX");
    const char* installPrefix =
      this->Makefile->GetSafeDefinition("CMAKE_INSTALL_PREFIX");
    cmSystemTools::ConvertToUnixSlashes(rootPath);
    std::vector<std::string> const& rdirs = this->GetRuntimeSearchPath();
    for (std::vector<std::string>::const_iterator ri = rdirs.begin();
         ri != rdirs.end(); ++ri) {
      // Put this directory in the rpath if using build-tree rpath
      // support or if using the link path as an rpath.
      if (use_build_rpath) {
        std::string d = *ri;
        if (!rootPath.empty() && d.find(rootPath) == 0) {
          d = d.substr(rootPath.size());
        } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
          std::string suffix = d.substr(strlen(stagePath));
          d = installPrefix;
          d += "/";
          d += suffix;
          cmSystemTools::ConvertToUnixSlashes(d);
        }
        if (emitted.insert(d).second) {
          runtimeDirs.push_back(d);
        }
      } else if (use_link_rpath) {
        // Do not add any path inside the source or build tree.
        const char* topSourceDir = this->CMakeInstance->GetHomeDirectory();
        const char* topBinaryDir =
          this->CMakeInstance->GetHomeOutputDirectory();
        if (!cmSystemTools::ComparePath(*ri, topSourceDir) &&
            !cmSystemTools::ComparePath(*ri, topBinaryDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topSourceDir) &&
            !cmSystemTools::IsSubDirectory(*ri, topBinaryDir)) {
          std::string d = *ri;
          if (!rootPath.empty() && d.find(rootPath) == 0) {
            d = d.substr(rootPath.size());
          } else if (stagePath && *stagePath && d.find(stagePath) == 0) {
            std::string suffix = d.substr(strlen(stagePath));
            d = installPrefix;
            d += "/";
            d += suffix;
            cmSystemTools::ConvertToUnixSlashes(d);
          }
          if (emitted.insert(d).second) {
            runtimeDirs.push_back(d);
          }
        }
      }
    }
  }

  // Add runtime paths required by the languages to always be
  // present.  This is done even when skipping rpath support.
  {
    cmGeneratorTarget::LinkClosure const* lc =
      this->Target->GetLinkClosure(this->Config);
    for (std::vector<std::string>::const_iterator li = lc->Languages.begin();
         li != lc->Languages.end(); ++li) {
      std::string useVar =
        "CMAKE_" + *li + "_USE_IMPLICIT_LINK_DIRECTORIES_IN_RUNTIME_PATH";
      if (this->Makefile->IsOn(useVar)) {
        std::string dirVar = "CMAKE_" + *li + "_IMPLICIT_LINK_DIRECTORIES";
        if (const char* dirs = this->Makefile->GetDefinition(dirVar)) {
          cmCLI_ExpandListUnique(dirs, runtimeDirs, emitted);
        }
      }
    }
  }

  // Add runtime paths required by the platform to always be
  // present.  This is done even when skipping rpath support.
  cmCLI_ExpandListUnique(this->RuntimeAlways.c_str(), runtimeDirs, emitted);
}